

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O0

ALLEGRO_SAMPLE * al_load_sample(char *filename)

{
  char *ext_00;
  ulong uVar1;
  ACODEC_TABLE *pAVar2;
  char *in_RDI;
  ACODEC_TABLE *ent;
  char *ext;
  ALLEGRO_SAMPLE *local_8;
  
  ext_00 = strrchr(in_RDI,0x2e);
  if (ext_00 == (char *)0x0) {
    uVar1 = _al_trace_prefix(__al_debug_channel,3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x104,"al_load_sample");
    if ((uVar1 & 1) != 0) {
      _al_trace_suffix("Unable to determine extension for %s.\n",in_RDI);
    }
    local_8 = (ALLEGRO_SAMPLE *)0x0;
  }
  else {
    pAVar2 = find_acodec_table_entry(ext_00);
    if ((pAVar2 == (ACODEC_TABLE *)0x0) ||
       (pAVar2->loader == (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0)) {
      uVar1 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                               ,0x10d,"al_load_sample");
      if ((uVar1 & 1) != 0) {
        _al_trace_suffix("No handler for audio file extension %s - therefore not trying to load %s.\n"
                         ,ext_00,in_RDI);
      }
      local_8 = (ALLEGRO_SAMPLE *)0x0;
    }
    else {
      local_8 = (*pAVar2->loader)(in_RDI);
    }
  }
  return local_8;
}

Assistant:

ALLEGRO_SAMPLE *al_load_sample(const char *filename)
{
   const char *ext;
   ACODEC_TABLE *ent;

   ASSERT(filename);
   ext = strrchr(filename, '.');
   if (ext == NULL) {
      ALLEGRO_ERROR("Unable to determine extension for %s.\n", filename);
      return NULL;
   }

   ent = find_acodec_table_entry(ext);
   if (ent && ent->loader) {
      return (ent->loader)(filename);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s - "
         "therefore not trying to load %s.\n", ext, filename);
   }

   return NULL;
}